

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_util.cc
# Opt level: O1

PackedFunc *
tvm::runtime::WrapPackedFunc
          (PackedFunc *__return_storage_ptr__,BackendPackedCFunc faddr,
          shared_ptr<tvm::runtime::ModuleNode> *sptr_to_self)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  peVar1 = (sptr_to_self->super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  this = (sptr_to_self->super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(BackendPackedCFunc *)local_48._M_unused._0_8_ = faddr;
  *(element_type **)((long)local_48._M_unused._0_8_ + 8) = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_48._M_unused._0_8_ + 0x10) = this;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  pcStack_30 = std::
               _Function_handler<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module_util.cc:68:21)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module_util.cc:68:21)>
             ::_M_manager;
  std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::function
            (&__return_storage_ptr__->body_,
             (function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return __return_storage_ptr__;
}

Assistant:

PackedFunc WrapPackedFunc(BackendPackedCFunc faddr,
                          const std::shared_ptr<ModuleNode> &sptr_to_self) {
  return PackedFunc([faddr, sptr_to_self](TVMArgs args, TVMRetValue *rv) {
    int ret = (*faddr)(
        const_cast<TVMValue *>(args.values),
        const_cast<int *>(args.type_codes),
        args.num_args);
    CHECK_EQ(ret, 0) << TVMGetLastError();
  });
}